

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int luaopen_mongo_driver(lua_State *L)

{
  undefined1 local_a8 [8];
  luaL_Reg l [9];
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(local_a8,&PTR_anon_var_dwarf_e4c4_001847a0,0x90);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,8);
  luaL_setfuncs(L,(luaL_Reg *)local_a8,0);
  return 1;
}

Assistant:

int
luaopen_mongo_driver(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] ={
		{ "query", op_query },
		{ "reply", op_reply },
		{ "kill", op_kill },
		{ "delete", op_delete },
		{ "more", op_get_more },
		{ "update", op_update },
		{ "insert", op_insert },
		{ "length", reply_length },
		{ NULL, NULL },
	};

	luaL_newlib(L,l);
	return 1;
}